

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall
Omega_h::clamp_metrics(Omega_h *this,LO nmetrics,Reals *metrics,Real h_min,Real h_max)

{
  LO nmetrics_00;
  Int IVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar2;
  Reals RVar3;
  Read<double> local_88;
  Read<double> local_78;
  Read<double> local_68 [2];
  Read<double> local_48;
  Int local_34;
  Real RStack_30;
  Int dim;
  Real h_max_local;
  Real h_min_local;
  Reals *metrics_local;
  Omega_h *pOStack_10;
  LO nmetrics_local;
  
  RStack_30 = h_max;
  h_max_local = h_min;
  h_min_local = (Real)metrics;
  metrics_local._4_4_ = nmetrics;
  pOStack_10 = this;
  Read<double>::Read(&local_48,metrics);
  IVar1 = get_metrics_dim(nmetrics,&local_48);
  Read<double>::~Read(&local_48);
  nmetrics_00 = metrics_local._4_4_;
  local_34 = IVar1;
  if (IVar1 == 3) {
    Read<double>::Read(local_68,metrics);
    clamp_metrics_dim<3>(this,nmetrics_00,local_68,h_max_local,RStack_30);
    Read<double>::~Read(local_68);
    pvVar2 = extraout_RDX;
  }
  else if (IVar1 == 2) {
    Read<double>::Read(&local_78,metrics);
    clamp_metrics_dim<2>(this,nmetrics_00,&local_78,h_max_local,RStack_30);
    Read<double>::~Read(&local_78);
    pvVar2 = extraout_RDX_00;
  }
  else {
    if (IVar1 != 1) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
           ,0x35);
    }
    Read<double>::Read(&local_88,metrics);
    clamp_metrics_dim<1>(this,nmetrics_00,&local_88,h_max_local,RStack_30);
    Read<double>::~Read(&local_88);
    pvVar2 = extraout_RDX_01;
  }
  RVar3.write_.shared_alloc_.direct_ptr = pvVar2;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals clamp_metrics(LO nmetrics, Reals metrics, Real h_min, Real h_max) {
  auto dim = get_metrics_dim(nmetrics, metrics);
  if (dim == 3) return clamp_metrics_dim<3>(nmetrics, metrics, h_min, h_max);
  if (dim == 2) return clamp_metrics_dim<2>(nmetrics, metrics, h_min, h_max);
  if (dim == 1) return clamp_metrics_dim<1>(nmetrics, metrics, h_min, h_max);
  OMEGA_H_NORETURN(Reals());
}